

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O3

Vec_Int_t * Unm_ManFindUsedNodes(Vec_Int_t *vPairs,int nObjs)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  void *__s;
  long lVar4;
  ulong uVar5;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar3 = (int *)malloc(4000);
  p->pArray = piVar3;
  iVar2 = 0x10;
  if (0xe < nObjs - 1U) {
    iVar2 = nObjs;
  }
  if (iVar2 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar2);
  }
  memset(__s,0,(long)nObjs);
  iVar2 = vPairs->nSize;
  if (0 < iVar2) {
    piVar3 = vPairs->pArray;
    lVar4 = 0;
    do {
      iVar1 = piVar3[lVar4];
      if (((long)iVar1 < 0) || (nObjs <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      *(undefined1 *)((long)__s + (long)iVar1) = 1;
      lVar4 = lVar4 + 3;
    } while ((int)lVar4 < iVar2);
  }
  if (nObjs < 1) {
    if (__s == (void *)0x0) goto LAB_00762ce1;
  }
  else {
    uVar5 = 0;
    do {
      if (*(char *)((long)__s + uVar5) != '\0') {
        Vec_IntPush(p,(int)uVar5);
      }
      uVar5 = uVar5 + 1;
    } while ((uint)nObjs != uVar5);
  }
  free(__s);
LAB_00762ce1:
  printf("The number of used nodes = %d\n",(ulong)(uint)p->nSize);
  return p;
}

Assistant:

Vec_Int_t * Unm_ManFindUsedNodes( Vec_Int_t * vPairs, int nObjs )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Vec_Str_t * vMarks = Vec_StrStart( nObjs ); int i;
    for ( i = 0; i < Vec_IntSize(vPairs); i += 3 )
        Vec_StrWriteEntry( vMarks, Vec_IntEntry(vPairs, i), 1 );
    for ( i = 0; i < nObjs; i++ )
        if ( Vec_StrEntry( vMarks, i ) )
            Vec_IntPush( vNodes, i );
    Vec_StrFree( vMarks );
    printf( "The number of used nodes = %d\n", Vec_IntSize(vNodes) );
    return vNodes;
}